

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O2

list<cv::Mat,_std::allocator<cv::Mat>_> *
randomWarps_abi_cxx11_
          (list<cv::Mat,_std::allocator<cv::Mat>_> *__return_storage_ptr__,Mat *plate,int n)

{
  uint uVar1;
  int in_R8D;
  bool bVar2;
  result_type_conflict2 rVar3;
  result_type_conflict2 rVar4;
  int local_29dc;
  _InputArray local_29d8;
  Mat *local_29c0;
  double local_29b8;
  double local_29b0;
  uniform_real_distribution<double> local_29a8;
  undefined4 local_2990 [2];
  Mat *local_2988;
  undefined8 local_2980;
  undefined1 local_2930 [16];
  Mat platew;
  Mat local_28c0 [96];
  Mat grey;
  Mat respl;
  Mat res;
  random_device rd;
  mt19937 gen;
  
  (__return_storage_ptr__->super__List_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl._M_node.
  _M_size = 0;
  local_29c0 = plate;
  std::random_device::random_device(&rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar1);
  if (n < 1) {
    n = 0;
  }
  local_29a8._M_param._M_a = -1.0;
  local_29a8._M_param._M_b = 1.0;
  local_29dc = n;
  while( true ) {
    bVar2 = local_29dc == 0;
    local_29dc = local_29dc + -1;
    if (bVar2) break;
    uVar1 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&gen,(ulong)uVar1);
    rVar3 = std::uniform_real_distribution<double>::operator()(&local_29a8,&gen);
    local_29b0 = rVar3 * 25.0;
    rVar3 = std::uniform_real_distribution<double>::operator()(&local_29a8,&gen);
    rVar4 = std::uniform_real_distribution<double>::operator()(&local_29a8,&gen);
    local_29b8 = rVar4 * 10.0;
    cv::Mat::Mat(&platew);
    cv::Mat::Mat(&respl);
    cv::Mat::Mat(&grey);
    cv::Mat::Mat(&res);
    rotateImage(local_29c0,&platew,local_29b0,rVar3 * 25.0,local_29b8,0.0,0.0,300.0,200.0);
    local_2980 = 0;
    local_29d8.sz.width = 0;
    local_29d8.sz.height = 0;
    local_2990[0] = 0x1010000;
    local_29d8.flags = 0x2010000;
    local_29d8.obj = &grey;
    local_2988 = &platew;
    cv::cvtColor((cv *)local_2990,&local_29d8,(_OutputArray *)0x6,0,in_R8D);
    local_29d8.sz.width = 0;
    local_29d8.sz.height = 0;
    local_29d8.flags = 0x1010000;
    local_29d8.obj = &grey;
    cv::boundingRect((_InputArray *)local_2930);
    cv::Mat::Mat((Mat *)local_2990,&platew,(Rect_ *)local_2930);
    cv::Mat::operator=(&res,(Mat *)local_2990);
    cv::Mat::~Mat((Mat *)local_2990);
    cv::Mat::Mat(local_28c0,&res);
    clearBg((Mat *)local_2990);
    std::__cxx11::list<cv::Mat,_std::allocator<cv::Mat>_>::push_back
              (__return_storage_ptr__,(value_type *)local_2990);
    cv::Mat::~Mat((Mat *)local_2990);
    cv::Mat::~Mat(local_28c0);
    cv::Mat::~Mat(&res);
    cv::Mat::~Mat(&grey);
    cv::Mat::~Mat(&respl);
    cv::Mat::~Mat(&platew);
  }
  std::random_device::~random_device(&rd);
  return __return_storage_ptr__;
}

Assistant:

list<cv::Mat> randomWarps(cv::Mat plate, int n) {
    list<cv::Mat> warps;

    random_device rd;  //Will be used to obtain a seed for the random number engine
    mt19937 gen(rd());
    uniform_real_distribution<> realgen(-1.f, 1.f);

    for (int i =0; i<n; i++) {
        gen.seed(rd());
        auto xangl = realgen(gen)*25.;
        auto yangl = realgen(gen)*25.;
        auto zangl = realgen(gen)*10.;
        cv::Mat platew, respl, grey, res;
        rotateImage(plate, platew, xangl, yangl,zangl, 0,0,300, 200);
        cv::cvtColor(platew, grey, cv::COLOR_BGR2GRAY);
        res = platew(cv::boundingRect(grey));
        warps.push_back(clearBg(res));
    }
    return warps; 
}